

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

MessageOptions * __thiscall
google::protobuf::DescriptorProto::mutable_options(DescriptorProto *this)

{
  uint32_t *puVar1;
  MessageOptions *pMVar2;
  MessageOptions *_msg;
  DescriptorProto *this_local;
  
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 2;
  pMVar2 = _internal_mutable_options(this);
  return pMVar2;
}

Assistant:

inline ::google::protobuf::MessageOptions* DescriptorProto::mutable_options() ABSL_ATTRIBUTE_LIFETIME_BOUND {
  _impl_._has_bits_[0] |= 0x00000002u;
  ::google::protobuf::MessageOptions* _msg = _internal_mutable_options();
  // @@protoc_insertion_point(field_mutable:google.protobuf.DescriptorProto.options)
  return _msg;
}